

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_basename(Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  char *pcVar2;
  Value local_a0;
  undefined1 local_90 [8];
  String result;
  char *duplicate;
  String pathStr;
  Value local_60 [2];
  String local_40;
  undefined1 local_30 [8];
  Value path;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  MiniScript::String::String(&local_40,"path");
  MiniScript::Context::GetVar((Context *)local_30,(String *)partialResult,(LocalOnlyMode)&local_40);
  MiniScript::String::~String(&local_40);
  bVar1 = MiniScript::Value::IsNull((Value *)local_30);
  if (bVar1) {
    MiniScript::Value::Value(local_60,(Value *)MiniScript::Value::zero);
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,local_60,true);
    MiniScript::Value::~Value(local_60);
    pathStr._12_4_ = 1;
  }
  else {
    MiniScript::Value::ToString((Value *)&duplicate,(Machine *)local_30);
    pcVar2 = MiniScript::String::c_str((String *)&duplicate);
    result._8_8_ = strdup(pcVar2);
    pcVar2 = __xpg_basename((char *)result._8_8_);
    MiniScript::String::String((String *)local_90,pcVar2);
    free((void *)result._8_8_);
    MiniScript::Value::Value(&local_a0,(String *)local_90);
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_a0,true);
    MiniScript::Value::~Value(&local_a0);
    pathStr._12_4_ = 1;
    MiniScript::String::~String((String *)local_90);
    MiniScript::String::~String((String *)&duplicate);
  }
  MiniScript::Value::~Value((Value *)local_30);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_basename(Context *context, IntrinsicResult partialResult) {
	Value path = context->GetVar("path");
	if (path.IsNull()) return IntrinsicResult(Value::zero);
	String pathStr = path.ToString();
	#if _WIN32 || _WIN64
		char driveBuf[3];
		char nameBuf[256];
		char extBuf[256];
		_splitpath_s(pathStr.c_str(), driveBuf, sizeof(driveBuf), nullptr, 0, nameBuf, sizeof(nameBuf), extBuf, sizeof(extBuf));
		String result = String(nameBuf) + String(extBuf);
	#elif defined(__APPLE__) || defined(__FreeBSD__)
		String result(basename((char*)pathStr.c_str()));
	#else
		char *duplicate = strdup((char*)pathStr.c_str());
		String result(basename(duplicate));
		free(duplicate);
	#endif
	return IntrinsicResult(result);
}